

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSources::ProcessRawPacket
          (RTPSources *this,RTPRawPacket *rawpack,RTPTransmitter **rtptrans,int numtrans,
          bool acceptownpackets)

{
  uint uVar1;
  int iVar2;
  RTPPacket *pRVar3;
  RTPAddress *pRVar4;
  long lVar5;
  bool bVar6;
  bool stored;
  RTPPacket *local_88;
  RTCPCompoundPacket rtcpcomppack;
  
  if (rawpack->isrtp == true) {
    pRVar3 = (RTPPacket *)operator_new(0x78,(this->super_RTPMemoryObject).mgr,0x19);
    RTPPacket::RTPPacket(pRVar3,rawpack,(this->super_RTPMemoryObject).mgr);
    iVar2 = pRVar3->error;
    if (iVar2 < 0) {
      RTPDelete<jrtplib::RTPPacket>(pRVar3,(this->super_RTPMemoryObject).mgr);
      if (iVar2 == -0x19) {
        return 0;
      }
      return iVar2;
    }
    _stored = _stored & 0xffffffffffffff00;
    pRVar4 = rawpack->senderaddress;
    uVar1 = 0;
    local_88 = pRVar3;
    for (lVar5 = 0; (pRVar3 = local_88, (uVar1 & 1) == 0 && (lVar5 < numtrans)); lVar5 = lVar5 + 1)
    {
      uVar1 = (*(rtptrans[lVar5]->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])
                        (rtptrans[lVar5],pRVar4);
    }
    if ((uVar1 & 1) == 0) {
      rtcpcomppack.super_RTPMemoryObject._vptr_RTPMemoryObject =
           (_func_int **)(rawpack->receivetime).m_t;
    }
    else {
      if (!acceptownpackets) goto LAB_001244eb;
      rtcpcomppack.super_RTPMemoryObject._vptr_RTPMemoryObject =
           (_func_int **)(rawpack->receivetime).m_t;
      pRVar4 = (RTPAddress *)0x0;
    }
    iVar2 = ProcessRTPPacket(this,local_88,(RTPTime *)&rtcpcomppack,pRVar4,&stored);
    if (iVar2 < 0) {
      if (((ulong)_stored & 1) == 0) {
        RTPDelete<jrtplib::RTPPacket>(pRVar3,(this->super_RTPMemoryObject).mgr);
        return iVar2;
      }
      return iVar2;
    }
    if (((ulong)_stored & 1) != 0) {
      return 0;
    }
LAB_001244eb:
    RTPDelete<jrtplib::RTPPacket>(pRVar3,(this->super_RTPMemoryObject).mgr);
    return 0;
  }
  RTCPCompoundPacket::RTCPCompoundPacket(&rtcpcomppack,rawpack,(this->super_RTPMemoryObject).mgr);
  if (rtcpcomppack.error < 0) {
    bVar6 = rtcpcomppack.error == -0x1e;
    goto LAB_00124539;
  }
  pRVar4 = rawpack->senderaddress;
  uVar1 = 0;
  for (lVar5 = 0; ((uVar1 & 1) == 0 && (lVar5 < numtrans)); lVar5 = lVar5 + 1) {
    uVar1 = (*(rtptrans[lVar5]->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])
                      (rtptrans[lVar5],pRVar4);
  }
  if ((uVar1 & 1) == 0) {
    _stored = (rawpack->receivetime).m_t;
    numtrans = ProcessRTCPCompoundPacket
                         (this,&rtcpcomppack,(RTPTime *)&stored,rawpack->senderaddress);
    if (-1 < numtrans) goto LAB_00124523;
  }
  else {
    bVar6 = true;
    if (!acceptownpackets) {
LAB_00124523:
      bVar6 = true;
      rtcpcomppack.error = numtrans;
      goto LAB_00124539;
    }
    _stored = (rawpack->receivetime).m_t;
    numtrans = ProcessRTCPCompoundPacket(this,&rtcpcomppack,(RTPTime *)&stored,(RTPAddress *)0x0);
    rtcpcomppack.error = numtrans;
    if (-1 < numtrans) goto LAB_00124539;
  }
  bVar6 = false;
  rtcpcomppack.error = numtrans;
LAB_00124539:
  RTCPCompoundPacket::~RTCPCompoundPacket(&rtcpcomppack);
  if (bVar6) {
    return 0;
  }
  return rtcpcomppack.error;
}

Assistant:

int RTPSources::ProcessRawPacket(RTPRawPacket *rawpack,RTPTransmitter *rtptrans[],int numtrans,bool acceptownpackets)
{
	int status;
	
	if (rawpack->IsRTP()) // RTP packet
	{
		RTPPacket *rtppack;
		
		// First, we'll see if the packet can be parsed
		rtppack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPPACKET) RTPPacket(*rawpack,GetMemoryManager());
		if (rtppack == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = rtppack->GetCreationError()) < 0)
		{
			if (status == ERR_RTP_PACKET_INVALIDPACKET)
			{
				RTPDelete(rtppack,GetMemoryManager());
				rtppack = 0;
			}
			else
			{
				RTPDelete(rtppack,GetMemoryManager());
				return status;
			}
		}
				
		// Check if the packet was valid
		if (rtppack != 0)
		{
			bool stored = false;
			bool ownpacket = false;
			int i;
			const RTPAddress *senderaddress = rawpack->GetSenderAddress();

			for (i = 0 ; !ownpacket && i < numtrans ; i++)
			{
				if (rtptrans[i]->ComesFromThisTransmitter(senderaddress))
					ownpacket = true;
			}
			
			// Check if the packet is our own.
			if (ownpacket)
			{
				// Now it depends on the user's preference
				// what to do with this packet:
				if (acceptownpackets)
				{
					// sender addres for own packets has to be NULL!
					if ((status = ProcessRTPPacket(rtppack,rawpack->GetReceiveTime(),0,&stored)) < 0)
					{
						if (!stored)
							RTPDelete(rtppack,GetMemoryManager());
						return status;
					}
				}
			}
			else 
			{
				if ((status = ProcessRTPPacket(rtppack,rawpack->GetReceiveTime(),senderaddress,&stored)) < 0)
				{
					if (!stored)
						RTPDelete(rtppack,GetMemoryManager());
					return status;
				}
			}
			if (!stored)
				RTPDelete(rtppack,GetMemoryManager());
		}
	}
	else // RTCP packet
	{
		RTCPCompoundPacket rtcpcomppack(*rawpack,GetMemoryManager());
		bool valid = false;
		
		if ((status = rtcpcomppack.GetCreationError()) < 0)
		{
			if (status != ERR_RTP_RTCPCOMPOUND_INVALIDPACKET)
				return status;
		}
		else
			valid = true;


		if (valid)
		{
			bool ownpacket = false;
			int i;
			const RTPAddress *senderaddress = rawpack->GetSenderAddress();

			for (i = 0 ; !ownpacket && i < numtrans ; i++)
			{
				if (rtptrans[i]->ComesFromThisTransmitter(senderaddress))
					ownpacket = true;
			}

			// First check if it's a packet of this session.
			if (ownpacket)
			{
				if (acceptownpackets)
				{
					// sender address for own packets has to be NULL
					status = ProcessRTCPCompoundPacket(&rtcpcomppack,rawpack->GetReceiveTime(),0);
					if (status < 0)
						return status;
				}
			}
			else // not our own packet
			{
				status = ProcessRTCPCompoundPacket(&rtcpcomppack,rawpack->GetReceiveTime(),rawpack->GetSenderAddress());
				if (status < 0)
					return status;
			}
		}
	}
	
	return 0;
}